

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MicroString::SetAlias
          (MicroString *this,string_view data,Arena *arena,size_t inline_capacity)

{
  string_view buffer;
  string_view data_00;
  string_view buffer_00;
  bool bVar1;
  LargeRepKind LVar2;
  int v1;
  int v2;
  LargeRep *pLVar3;
  char *failure_msg;
  LogMessage *pLVar4;
  LogMessage local_90;
  Voidify local_79;
  Nullable<const_char_*> local_78;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t local_68;
  LargeRep *local_60;
  LargeRep *h;
  size_t local_50;
  MicroString *local_48;
  size_t local_40;
  LargeRep *local_38;
  LargeRep *h_1;
  size_t inline_capacity_local;
  Arena *arena_local;
  MicroString *this_local;
  string_view data_local;
  
  data_local._M_len = (size_t)data._M_str;
  this_local = (MicroString *)data._M_len;
  h_1 = (LargeRep *)inline_capacity;
  inline_capacity_local = (size_t)arena;
  arena_local = (Arena *)this;
  bVar1 = is_large_rep(this);
  if ((bVar1) && (LVar2 = large_rep_kind(this), LVar2 == kAlias)) {
    local_38 = large_rep(this);
    local_48 = this_local;
    local_40 = data_local._M_len;
    buffer_00._M_str = (char *)data_local._M_len;
    buffer_00._M_len = (size_t)this_local;
    LargeRep::SetExternalBuffer(local_38,buffer_00);
  }
  else {
    pLVar3 = (LargeRep *)
             std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (h_1 < pLVar3) {
      bVar1 = is_large_rep(this);
      if ((bVar1) && (LVar2 = large_rep_kind(this), LVar2 == kAlias)) {
        local_60 = large_rep(this);
      }
      else {
        if (inline_capacity_local == 0) {
          Destroy(this);
        }
        local_60 = Arena::Create<google::protobuf::internal::MicroString::LargeRep>
                             ((Arena *)inline_capacity_local);
        local_60->capacity = 0;
        this->rep_ = (void *)((ulong)local_60 | 1);
      }
      absl_log_internal_check_op_result = (Nullable<const_char_*>)this_local;
      local_68 = data_local._M_len;
      buffer._M_str = (char *)data_local._M_len;
      buffer._M_len = (size_t)this_local;
      LargeRep::SetExternalBuffer(local_60,buffer);
      LVar2 = large_rep_kind(this);
      v1 = absl::lts_20250127::log_internal::GetReferenceableValue(LVar2);
      v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
      local_78 = absl::lts_20250127::log_internal::Check_EQImpl
                           (v1,v2,"+large_rep_kind() == +kAlias");
      if (local_78 != (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_78);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_90,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
                   ,0x104,failure_msg);
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_90);
      }
    }
    else {
      h = (LargeRep *)this_local;
      local_50 = data_local._M_len;
      data_00._M_str = (char *)data_local._M_len;
      data_00._M_len = (size_t)this_local;
      Set(this,data_00,(Arena *)inline_capacity_local,(size_t)h_1);
    }
  }
  return;
}

Assistant:

void MicroString::SetAlias(absl::string_view data, Arena* arena,
                           size_t inline_capacity) {
  // If we already have an alias, reuse the block.
  if (is_large_rep() && large_rep_kind() == kAlias) {
    auto* h = large_rep();
    h->SetExternalBuffer(data);
    return;
  }
  // If we can fit in the inline rep, avoid allocating memory.
  if (data.size() <= inline_capacity) {
    return Set(data, arena, inline_capacity);
  }

  LargeRep* h;
  if (!is_large_rep() || large_rep_kind() != kAlias) {
    if (arena == nullptr) {
      Destroy();
    }

    h = Arena::Create<LargeRep>(arena);
    h->capacity = kAlias;
    rep_ = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) |
                                   kIsLargeRepTag);
  } else {
    h = large_rep();
  }
  h->SetExternalBuffer(data);
  ABSL_DCHECK_EQ(+large_rep_kind(), +kAlias);
}